

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

LY_ERR lyjson_ctx_next(lyjson_ctx *jsonctx,LYJSON_PARSER_STATUS *status)

{
  LYJSON_PARSER_STATUS LVar1;
  LY_ERR local_1c;
  LYJSON_PARSER_STATUS cur;
  LY_ERR ret;
  LYJSON_PARSER_STATUS *status_local;
  lyjson_ctx *jsonctx_local;
  
  local_1c = LY_SUCCESS;
  if (jsonctx == (lyjson_ctx *)0x0) {
    __assert_fail("jsonctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                  0x3d6,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)");
  }
  LVar1 = lyjson_ctx_status(jsonctx);
  switch(LVar1) {
  case LYJSON_ERROR:
    ly_log(jsonctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",0x408);
    local_1c = LY_EINT;
    goto LAB_001278f1;
  case LYJSON_OBJECT:
    local_1c = lyjson_next_object_name(jsonctx);
    goto joined_r0x001276e2;
  case LYJSON_OBJECT_NEXT:
    if ((jsonctx->status).count == 0) {
      __assert_fail("jsonctx->status.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                    0x3e1,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)"
                   );
    }
    (jsonctx->status).count = (jsonctx->status).count - 1;
    local_1c = lyjson_next_object_name(jsonctx);
joined_r0x001276e2:
    if (local_1c != LY_SUCCESS) goto LAB_001278f1;
    goto switchD_0012765e_default;
  case LYJSON_OBJECT_CLOSED:
  case LYJSON_ARRAY_CLOSED:
    if ((jsonctx->status).count == 0) {
      __assert_fail("jsonctx->status.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                    0x3ef,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)"
                   );
    }
    (jsonctx->status).count = (jsonctx->status).count - 1;
  case LYJSON_NUMBER:
  case LYJSON_STRING:
  case LYJSON_TRUE:
  case LYJSON_FALSE:
  case LYJSON_NULL:
    lyjson_ctx_set_value(jsonctx,(char *)0x0,0,'\0');
    if ((jsonctx->status).count == 0) {
      __assert_fail("jsonctx->status.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                    0x3f7,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)"
                   );
    }
    (jsonctx->status).count = (jsonctx->status).count - 1;
    LVar1 = lyjson_ctx_status(jsonctx);
    if (LVar1 == LYJSON_OBJECT) {
      local_1c = lyjson_next_object_item(jsonctx);
    }
    else {
      if (LVar1 != LYJSON_ARRAY) {
        if (LVar1 != LYJSON_END) {
          __assert_fail("cur == LYJSON_END",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c"
                        ,0x402,
                        "LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)");
        }
        goto LAB_001278f1;
      }
      local_1c = lyjson_next_array_item(jsonctx);
    }
    break;
  case LYJSON_ARRAY:
    local_1c = lyjson_next_value(jsonctx,'\x01');
    break;
  case LYJSON_ARRAY_NEXT:
    if ((jsonctx->status).count == 0) {
      __assert_fail("jsonctx->status.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                    0x3e5,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)"
                   );
    }
    (jsonctx->status).count = (jsonctx->status).count - 1;
    local_1c = lyjson_next_value(jsonctx,'\0');
    break;
  case LYJSON_OBJECT_NAME:
    lyjson_ctx_set_value(jsonctx,(char *)0x0,0,'\0');
    if ((jsonctx->status).count == 0) {
      __assert_fail("jsonctx->status.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                    0x3ea,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)"
                   );
    }
    (jsonctx->status).count = (jsonctx->status).count - 1;
    local_1c = lyjson_next_value(jsonctx,'\0');
    break;
  case LYJSON_END:
    local_1c = lyjson_next_value(jsonctx,'\0');
    break;
  default:
    goto switchD_0012765e_default;
  }
  if (local_1c == LY_SUCCESS) {
switchD_0012765e_default:
    lyjson_skip_ws(jsonctx);
  }
LAB_001278f1:
  if ((local_1c == LY_SUCCESS) && (status != (LYJSON_PARSER_STATUS *)0x0)) {
    LVar1 = lyjson_ctx_status(jsonctx);
    *status = LVar1;
  }
  return local_1c;
}

Assistant:

LY_ERR
lyjson_ctx_next(struct lyjson_ctx *jsonctx, enum LYJSON_PARSER_STATUS *status)
{
    LY_ERR ret = LY_SUCCESS;
    enum LYJSON_PARSER_STATUS cur;

    assert(jsonctx);

    cur = lyjson_ctx_status(jsonctx);
    switch (cur) {
    case LYJSON_OBJECT:
        LY_CHECK_GOTO(ret = lyjson_next_object_name(jsonctx), cleanup);
        break;
    case LYJSON_ARRAY:
        LY_CHECK_GOTO(ret = lyjson_next_value(jsonctx, 1), cleanup);
        break;
    case LYJSON_OBJECT_NEXT:
        LYJSON_STATUS_POP(jsonctx);
        LY_CHECK_GOTO(ret = lyjson_next_object_name(jsonctx), cleanup);
        break;
    case LYJSON_ARRAY_NEXT:
        LYJSON_STATUS_POP(jsonctx);
        LY_CHECK_GOTO(ret = lyjson_next_value(jsonctx, 0), cleanup);
        break;
    case LYJSON_OBJECT_NAME:
        lyjson_ctx_set_value(jsonctx, NULL, 0, 0);
        LYJSON_STATUS_POP(jsonctx);
        LY_CHECK_GOTO(ret = lyjson_next_value(jsonctx, 0), cleanup);
        break;
    case LYJSON_OBJECT_CLOSED:
    case LYJSON_ARRAY_CLOSED:
        LYJSON_STATUS_POP(jsonctx);
    /* fallthrough */
    case LYJSON_NUMBER:
    case LYJSON_STRING:
    case LYJSON_TRUE:
    case LYJSON_FALSE:
    case LYJSON_NULL:
        lyjson_ctx_set_value(jsonctx, NULL, 0, 0);
        LYJSON_STATUS_POP(jsonctx);
        cur = lyjson_ctx_status(jsonctx);

        if (cur == LYJSON_OBJECT) {
            LY_CHECK_GOTO(ret = lyjson_next_object_item(jsonctx), cleanup);
            break;
        } else if (cur == LYJSON_ARRAY) {
            LY_CHECK_GOTO(ret = lyjson_next_array_item(jsonctx), cleanup);
            break;
        }

        assert(cur == LYJSON_END);
        goto cleanup;
    case LYJSON_END:
        LY_CHECK_GOTO(ret = lyjson_next_value(jsonctx, 0), cleanup);
        break;
    case LYJSON_ERROR:
        LOGINT(jsonctx->ctx);
        ret = LY_EINT;
        goto cleanup;
    }

    /* skip WS */
    lyjson_skip_ws(jsonctx);

cleanup:
    if (!ret && status) {
        *status = lyjson_ctx_status(jsonctx);
    }
    return ret;
}